

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmakeevaluator.cpp
# Opt level: O2

VisitReturn __thiscall
QMakeEvaluator::evaluateExpandFunction
          (QMakeEvaluator *this,ProKey *func,ushort **tokPtr,ProStringList *ret)

{
  Span *pSVar1;
  Span *pSVar2;
  VisitReturn VVar3;
  storage_type *psVar4;
  ulong uVar5;
  storage_type_conflict *psVar6;
  char16_t *pcVar7;
  long in_FS_OFFSET;
  const_iterator cVar8;
  const_iterator cVar9;
  QByteArrayView QVar10;
  QArrayDataPointer<char16_t> local_b0;
  QArrayDataPointer<char> local_98;
  QStringView local_80;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  cVar8 = QHash<ProKey,_QMakeInternal::QMakeBuiltin>::constFindImpl<ProKey>
                    ((QHash<ProKey,_QMakeInternal::QMakeBuiltin> *)(QMakeInternal::statics + 0x240),
                     func);
  if (cVar8.i.d == (Data<QHashPrivate::Node<ProKey,_QMakeInternal::QMakeBuiltin>_> *)0x0 &&
      cVar8.i.bucket == 0) {
    cVar9 = QHash<ProKey,_ProFunctionDef>::constFindImpl<ProKey>
                      (&(this->m_functionDefs).replaceFunctions,func);
    if (cVar9.i.d == (Data<QHashPrivate::Node<ProKey,_ProFunctionDef>_> *)0x0 && cVar9.i.bucket == 0
       ) {
      skipExpression(this,tokPtr);
      psVar4 = (storage_type *)
               QByteArrayView::lengthHelperCharArray
                         ("\'%1\' is not a recognized replace function.",0x2b);
      QVar10.m_data = psVar4;
      QVar10.m_size = (qsizetype)&local_70;
      QString::fromLatin1(QVar10);
      local_58.ptr = (ProString *)(func->super_ProString).m_string.d.ptr;
      local_58.d = (Data *)(func->super_ProString).m_string.d.size;
      local_98._0_16_ =
           QStringView::mid((QStringView *)&local_58,(long)(func->super_ProString).m_offset,
                            (long)(func->super_ProString).m_length);
      VVar3 = ReturnFalse;
      QString::arg<QStringView,_true>
                ((QString *)&local_58,(QString *)&local_70,(QStringView *)&local_98,0,(QChar)0x20);
      evalError(this,(QString *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_58);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
    }
    else {
      local_58.d = (Data *)0x0;
      local_58.ptr = (ProString *)0x0;
      local_58.size = 0;
      VVar3 = prepareFunctionArgs(this,tokPtr,(QList<ProStringList> *)&local_58);
      if (VVar3 == ReturnError) {
        VVar3 = ReturnError;
      }
      else {
        if (this->m_debugLevel != 0) {
          local_70.ptr = (func->super_ProString).m_string.d.ptr;
          local_70.d = (Data *)(func->super_ProString).m_string.d.size;
          local_80 = QStringView::mid((QStringView *)&local_70,
                                      (long)(func->super_ProString).m_offset,
                                      (long)(func->super_ProString).m_length);
          QStringView::toLocal8Bit((QByteArray *)&local_70,&local_80);
          pcVar7 = local_70.ptr;
          if (local_70.ptr == (char16_t *)0x0) {
            pcVar7 = (char16_t *)&QByteArray::_empty;
          }
          formatValueListList((QString *)&local_b0,(QList<ProStringList> *)&local_58);
          QString::toLocal8Bit((QByteArray *)&local_98,(QString *)&local_b0);
          psVar6 = (storage_type_conflict *)local_98.ptr;
          if ((storage_type_conflict *)local_98.ptr == (storage_type_conflict *)0x0) {
            psVar6 = (storage_type_conflict *)&QByteArray::_empty;
          }
          traceMsgInternal(this,"calling $$%s(%s)",pcVar7,psVar6);
          QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b0);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_70);
        }
        pSVar2 = (cVar9.i.d)->spans;
        uVar5 = cVar9.i.bucket >> 7;
        VVar3 = evaluateFunction(this,(ProFunctionDef *)
                                      (pSVar2[uVar5].entries
                                       [pSVar2[uVar5].offsets[(uint)cVar9.i.bucket & 0x7f]].storage.
                                       data + 0x30),(QList<ProStringList> *)&local_58,ret);
      }
      QArrayDataPointer<ProStringList>::~QArrayDataPointer
                ((QArrayDataPointer<ProStringList> *)&local_58);
    }
  }
  else {
    local_58.d = (Data *)0x0;
    local_58.ptr = (ProString *)0x0;
    local_58.size = 0;
    VVar3 = expandVariableReferences(this,tokPtr,5,(ProStringList *)&local_58,true);
    if (VVar3 == ReturnError) {
      VVar3 = ReturnError;
    }
    else {
      pSVar1 = (cVar8.i.d)->spans;
      uVar5 = cVar8.i.bucket >> 7;
      VVar3 = evaluateBuiltinExpand
                        (this,(QMakeBuiltin *)
                              (pSVar1[uVar5].entries
                               [pSVar1[uVar5].offsets[(uint)cVar8.i.bucket & 0x7f]].storage.data +
                              0x30),func,(ProStringList *)&local_58,ret);
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return VVar3;
  }
  __stack_chk_fail();
}

Assistant:

QMakeEvaluator::VisitReturn QMakeEvaluator::evaluateExpandFunction(
        const ProKey &func, const ushort *&tokPtr, ProStringList *ret)
{
    auto adef = statics.expands.constFind(func);
    if (adef != statics.expands.constEnd()) {
        //why don't the builtin functions just use args_list? --Sam
        ProStringList args;
        if (expandVariableReferences(tokPtr, 5, &args, true) == ReturnError)
            return ReturnError;
        return evaluateBuiltinExpand(*adef, func, args, *ret);
    }

    QHash<ProKey, ProFunctionDef>::ConstIterator it =
            m_functionDefs.replaceFunctions.constFind(func);
    if (it != m_functionDefs.replaceFunctions.constEnd()) {
        QList<ProStringList> args;
        if (prepareFunctionArgs(tokPtr, &args) == ReturnError)
            return ReturnError;
        traceMsg("calling $$%s(%s)", dbgKey(func), dbgStrListList(args));
        return evaluateFunction(*it, args, ret);
    }

    skipExpression(tokPtr);
    evalError(fL1S("'%1' is not a recognized replace function.").arg(func.toQStringView()));
    return ReturnFalse;
}